

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall Sudoku::Sudoku(Sudoku *this,int seed)

{
  time_t tVar1;
  
  memset(this,0,0x1bc);
  if (seed != -1) {
    if (seed == 0) {
      tVar1 = time((time_t *)0x0);
      seed = (int)tVar1;
    }
    srand(seed);
    rekurzivniReseni(this);
    skryjNa30(this);
    restart(this);
    return;
  }
  return;
}

Assistant:

Sudoku::Sudoku( int seed )
{
  initPole();
  //stav temp;
  if (seed == -1) // prazdne puzzle
    return;
  if (seed == 0)// ciste nahodne puzzle
  {
    srand(time(0));
  }
  else// puzzle dane zadanou ciselnou hodnotou
  {
    srand(seed);
  }
  rekurzivniReseni(); // vyresime
  skryjNa30(); // nechame 30 odkrytych cisel tak, aby bylo mozne sudoku vyresit zakladnimi metodami
  restart(); // zrus vsechny ne-pevna cisla
}